

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

DisasJumpType op_vsra(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint uVar2;
  TCGContext_conflict12 *s_00;
  TCGTemp *pTVar3;
  int64_t arg2;
  uintptr_t o_1;
  TCGv_i64 dst;
  
  s_00 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
  if (((s->fields).presentO & 0x1000000) != 0) {
    dst = (TCGv_i64)((long)pTVar3 - (long)s_00);
    read_vec_element_i64(s_00,dst,(uint8_t)(s->fields).c[2],'\a',MO_8);
    arg2 = 0x78;
    if ((s->fields).field_0x9 == '~') {
      arg2 = 7;
    }
    tcg_gen_andi_i64_s390x(s_00,dst,dst,arg2);
    uVar1 = (s->fields).presentO;
    if ((uVar1 >> 0x16 & 1) != 0) {
      uVar2 = (s->fields).c[0];
      if ((uVar2 & 0xe0) == 0) {
        if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00cda334;
        uVar1 = (s->fields).c[6];
        if ((uVar1 & 0xe0) == 0) {
          tcg_gen_gvec_2i_ool_s390x
                    (s_00,(uVar2 & 0x1f) * 0x10 + 0x80,(uVar1 & 0x1f) * 0x10 + 0x80,dst,0x10,0x10,0,
                     gen_helper_gvec_vsra);
          tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(dst + (long)s_00));
          return DISAS_NEXT;
        }
      }
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                 ,0xdf,"reg < 32");
    }
  }
LAB_00cda334:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vsra(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 shift = tcg_temp_new_i64(tcg_ctx);

    read_vec_element_i64(tcg_ctx, shift, get_field(s, v3), 7, ES_8);
    if (s->fields.op2 == 0x7e) {
        tcg_gen_andi_i64(tcg_ctx, shift, shift, 0x7);
    } else {
        tcg_gen_andi_i64(tcg_ctx, shift, shift, 0x78);
    }

    gen_gvec_2i_ool(tcg_ctx, get_field(s, v1), get_field(s, v2),
                    shift, 0, gen_helper_gvec_vsra);
    tcg_temp_free_i64(tcg_ctx, shift);
    return DISAS_NEXT;
}